

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_wrap.hpp
# Opt level: O0

string * __thiscall
chaiscript::json_wrap::to_json_abi_cxx11_
          (string *__return_storage_ptr__,json_wrap *this,Boxed_Value *t_bv)

{
  allocator<char> local_61;
  string local_60;
  JSON local_40;
  json_wrap *local_18;
  Boxed_Value *t_bv_local;
  
  local_18 = this;
  t_bv_local = (Boxed_Value *)__return_storage_ptr__;
  to_json_object(&local_40,(Boxed_Value *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"  ",&local_61);
  json::JSON::dump(__return_storage_ptr__,&local_40,1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  json::JSON::~JSON(&local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_json(const Boxed_Value &t_bv) { return to_json_object(t_bv).dump(); }